

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll-close.c
# Opt level: O3

int run_test_poll_close(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_poll_t *handle;
  long lVar3;
  int64_t eval_b;
  int64_t eval_a;
  uv_poll_t poll_handles [64];
  uv_poll_t auStack_2018 [64];
  
  lVar3 = 0;
  do {
    iVar1 = socket(2,1,0);
    puVar2 = uv_default_loop();
    handle = (uv_poll_t *)((long)&auStack_2018[0].data + lVar3);
    uv_poll_init(puVar2,handle,iVar1);
    uv_poll_start(handle,3,(uv_poll_cb)0x0);
    lVar3 = lVar3 + 0x80;
  } while (lVar3 != 0x2000);
  lVar3 = 0;
  do {
    uv_close((uv_handle_t *)((long)&auStack_2018[0].data + lVar3),close_cb);
    lVar3 = lVar3 + 0x80;
  } while (lVar3 != 0x2000);
  puVar2 = uv_default_loop();
  uv_run(puVar2,UV_RUN_DEFAULT);
  if (close_cb_called == 0x40) {
    puVar2 = uv_default_loop();
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    uv_run(puVar2,UV_RUN_DEFAULT);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_poll_close_cold_1();
  }
  run_test_poll_close_cold_2();
  close_cb_called = close_cb_called + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(poll_close) {
  uv_os_sock_t sockets[NUM_SOCKETS];
  uv_poll_t poll_handles[NUM_SOCKETS];
  int i;

#ifdef _WIN32
  {
    struct WSAData wsa_data;
    int r = WSAStartup(MAKEWORD(2, 2), &wsa_data);
    ASSERT_OK(r);
  }
#endif

  for (i = 0; i < NUM_SOCKETS; i++) {
    sockets[i] = socket(AF_INET, SOCK_STREAM, 0);
    uv_poll_init(uv_default_loop(), &poll_handles[i], sockets[i]);
    uv_poll_start(&poll_handles[i], UV_READABLE | UV_WRITABLE, NULL);
  }

  for (i = 0; i < NUM_SOCKETS; i++) {
    uv_close((uv_handle_t*) &poll_handles[i], close_cb);
  }

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(close_cb_called, NUM_SOCKETS);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}